

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapArenaStringPtr
               (ArenaStringPtr *lhs,Arena *lhs_arena,ArenaStringPtr *rhs,Arena *rhs_arena)

{
  void *pvVar1;
  long lVar2;
  undefined8 *puVar3;
  string temp;
  string local_48;
  
  if (lhs_arena == rhs_arena) {
    puVar3 = (undefined8 *)(rhs->tagged_ptr_).ptr_;
    (rhs->tagged_ptr_).ptr_ = (lhs->tagged_ptr_).ptr_;
  }
  else {
    pvVar1 = (lhs->tagged_ptr_).ptr_;
    if (((ulong)pvVar1 & 3) == 0) {
      if (((ulong)(rhs->tagged_ptr_).ptr_ & 3) == 0) {
        return;
      }
      if (((ulong)pvVar1 & 3) == 0) {
        ArenaStringPtr::Set<>
                  (lhs,(string *)((ulong)(rhs->tagged_ptr_).ptr_ & 0xfffffffffffffffc),lhs_arena);
        ArenaStringPtr::Destroy(rhs);
        (rhs->tagged_ptr_).ptr_ = &fixed_address_empty_string;
        return;
      }
    }
    if (((ulong)(rhs->tagged_ptr_).ptr_ & 3) != 0) {
      lVar2 = *(long *)((ulong)pvVar1 & 0xfffffffffffffffc);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,lVar2,((long *)((ulong)pvVar1 & 0xfffffffffffffffc))[1] + lVar2
                );
      ArenaStringPtr::Set<>
                (lhs,(string *)((ulong)(rhs->tagged_ptr_).ptr_ & 0xfffffffffffffffc),lhs_arena);
      ArenaStringPtr::Set(rhs,&local_48,rhs_arena);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return;
    }
    ArenaStringPtr::Set<>(rhs,(string *)((ulong)pvVar1 & 0xfffffffffffffffc),rhs_arena);
    ArenaStringPtr::Destroy(lhs);
    puVar3 = &fixed_address_empty_string;
  }
  (lhs->tagged_ptr_).ptr_ = puVar3;
  return;
}

Assistant:

void SwapFieldHelper::SwapArenaStringPtr(ArenaStringPtr* lhs, Arena* lhs_arena,
                                         ArenaStringPtr* rhs,
                                         Arena* rhs_arena) {
  if (lhs_arena == rhs_arena) {
    ArenaStringPtr::InternalSwap(lhs, rhs, lhs_arena);
  } else if (lhs->IsDefault() && rhs->IsDefault()) {
    // Nothing to do.
  } else if (lhs->IsDefault()) {
    lhs->Set(rhs->Get(), lhs_arena);
    // rhs needs to be destroyed before overwritten.
    rhs->Destroy();
    rhs->InitDefault();
  } else if (rhs->IsDefault()) {
    rhs->Set(lhs->Get(), rhs_arena);
    // lhs needs to be destroyed before overwritten.
    lhs->Destroy();
    lhs->InitDefault();
  } else {
    std::string temp = lhs->Get();
    lhs->Set(rhs->Get(), lhs_arena);
    rhs->Set(std::move(temp), rhs_arena);
  }
}